

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

TaggedStringPtr __thiscall
google::protobuf::internal::TaggedStringPtr::ForceCopy(TaggedStringPtr *this,Arena *arena)

{
  char *pcVar1;
  anon_unknown_8 *this_00;
  size_t *psVar2;
  TaggedStringPtr TVar3;
  char *in_RCX;
  string_view s;
  string_view value;
  
  psVar2 = (size_t *)((ulong)this->ptr_ & 0xfffffffffffffffc);
  pcVar1 = (char *)*psVar2;
  this_00 = (anon_unknown_8 *)psVar2[1];
  if (arena != (Arena *)0x0) {
    s._M_str = in_RCX;
    s._M_len = (size_t)pcVar1;
    TVar3 = anon_unknown_8::CreateArenaString((anon_unknown_8 *)arena,(Arena *)this_00,s);
    return (TaggedStringPtr)TVar3.ptr_;
  }
  value._M_str = pcVar1;
  value._M_len = (size_t)pcVar1;
  TVar3 = anon_unknown_8::CreateString(this_00,value);
  return (TaggedStringPtr)TVar3.ptr_;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }